

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rate_adaptive_code.cpp
# Opt level: O2

void __thiscall
rate_adaptive_code_from_colptr_rowIdx_equals_not_equals_operators_Test::
rate_adaptive_code_from_colptr_rowIdx_equals_not_equals_operators_Test
          (rate_adaptive_code_from_colptr_rowIdx_equals_not_equals_operators_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0019ce00;
  return;
}

Assistant:

TEST(rate_adaptive_code_from_colptr_rowIdx, equals_not_equals_operators) {
    auto H1 = get_code_big_wra();
    auto H2 = get_code_big_wra();
    EXPECT_FALSE(H1 != H2);
    EXPECT_TRUE(H1 == H2);
    H1.set_rate(1);
    EXPECT_FALSE(H1 == H2);
    EXPECT_TRUE(H1 != H2);
}